

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<int,_int,_2U>::iterator::updateParentBounds
          (iterator *this,uint32_t level,interval<int> *key)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  
  pEVar1 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  for (lVar2 = (ulong)level << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    uVar3 = (ulong)*(uint *)((long)pEVar1 + lVar2 + -4);
    if (lVar2 == 0x10) {
      piVar4 = (int *)((long)pEVar1->node + uVar3 * 8 + 0x10);
    }
    else {
      piVar4 = (int *)(*(long *)((long)&pEVar1[-1].node + lVar2) + uVar3 * 8 + 0x60);
    }
    iVar5 = *piVar4;
    if (key->left < *piVar4) {
      iVar5 = key->left;
    }
    *piVar4 = iVar5;
    iVar5 = key->right;
    if (key->right < piVar4[1]) {
      iVar5 = piVar4[1];
    }
    piVar4[1] = iVar5;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::updateParentBounds(
    uint32_t level, const IntervalMapDetails::interval<TKey>& key) {
    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        auto& existing = level == 0 ? path.template node<RootBranch>(level).keyAt(offset)
                                    : path.template node<Branch>(level).keyAt(offset);
        existing.unionWith(key);
    }
}